

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5IterSetOutputs_Col100(Fts5Iter *pIter,Fts5SegIter *pSeg)

{
  byte bVar1;
  int iVar2;
  Fts5Colset *pFVar3;
  u8 *puVar4;
  int iVar5;
  u8 *puVar6;
  byte *pbVar7;
  byte *pbVar8;
  int *piVar9;
  int iVar10;
  
  iVar5 = pSeg->nPos;
  if (pSeg->pLeaf->szLeaf < iVar5 + pSeg->iLeafOffset) {
    (pIter->poslist).n = 0;
    fts5SegiterPoslist(pIter->pIndex,pSeg,pIter->pColset,&pIter->poslist);
    (pIter->base).iRowid = pSeg->iRowid;
    (pIter->base).pData = (pIter->poslist).p;
    iVar5 = (pIter->poslist).n;
  }
  else {
    pbVar7 = pSeg->pLeaf->p + pSeg->iLeafOffset;
    puVar6 = (pIter->poslist).p;
    pFVar3 = pIter->pColset;
    iVar2 = pFVar3->nCol;
    (pIter->base).iRowid = pSeg->iRowid;
    if (0 < iVar5) {
      pbVar8 = pbVar7 + iVar5;
      piVar9 = pFVar3->aiCol;
      iVar5 = 0;
      iVar10 = 0;
      do {
        bVar1 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        iVar10 = iVar10 + (uint)bVar1 + -2;
        while (*piVar9 < iVar10) {
          piVar9 = piVar9 + 1;
          if (piVar9 == pFVar3->aiCol + iVar2) goto LAB_001cdb96;
        }
        if (*piVar9 == iVar10) {
          *puVar6 = ((char)iVar10 - (char)iVar5) + '\x02';
          puVar6 = puVar6 + 1;
          iVar5 = iVar10;
        }
      } while (pbVar7 < pbVar8);
    }
LAB_001cdb96:
    puVar4 = (pIter->poslist).p;
    (pIter->base).pData = puVar4;
    iVar5 = (int)puVar6 - (int)puVar4;
  }
  (pIter->base).nData = iVar5;
  return;
}

Assistant:

static void fts5IterSetOutputs_Col100(Fts5Iter *pIter, Fts5SegIter *pSeg){

  assert( pIter->pIndex->pConfig->eDetail==FTS5_DETAIL_COLUMNS );
  assert( pIter->pColset );

  if( pSeg->iLeafOffset+pSeg->nPos>pSeg->pLeaf->szLeaf ){
    fts5IterSetOutputs_Col(pIter, pSeg);
  }else{
    u8 *a = (u8*)&pSeg->pLeaf->p[pSeg->iLeafOffset];
    u8 *pEnd = (u8*)&a[pSeg->nPos]; 
    int iPrev = 0;
    int *aiCol = pIter->pColset->aiCol;
    int *aiColEnd = &aiCol[pIter->pColset->nCol];

    u8 *aOut = pIter->poslist.p;
    int iPrevOut = 0;

    pIter->base.iRowid = pSeg->iRowid;

    while( a<pEnd ){
      iPrev += (int)a++[0] - 2;
      while( *aiCol<iPrev ){
        aiCol++;
        if( aiCol==aiColEnd ) goto setoutputs_col_out;
      }
      if( *aiCol==iPrev ){
        *aOut++ = (u8)((iPrev - iPrevOut) + 2);
        iPrevOut = iPrev;
      }
    }

setoutputs_col_out:
    pIter->base.pData = pIter->poslist.p;
    pIter->base.nData = aOut - pIter->poslist.p;
  }
}